

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O0

void caffe::UpgradeV0PaddingLayers(NetParameter *param,NetParameter *param_upgraded_pad)

{
  mapped_type_conflict1 mVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint32 value;
  mapped_type_conflict1 *pmVar5;
  string *psVar6;
  ostream *poVar7;
  V0LayerParameter *pVVar8;
  V1LayerParameter *pVVar9;
  V0LayerParameter *this;
  string *blob_name_2;
  int j_1;
  int layer_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  null_stream local_b2;
  null_stream local_b1;
  V1LayerParameter *local_b0;
  V1LayerParameter *source_layer;
  iterator iStack_a0;
  int top_idx;
  _Self local_98;
  string *local_90;
  string *blob_name_1;
  V0LayerParameter *pVStack_80;
  int j;
  V0LayerParameter *layer_param;
  V1LayerParameter *layer_connection;
  string *psStack_68;
  int i_1;
  string *blob_name;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  blob_name_to_last_top_idx;
  NetParameter *param_upgraded_pad_local;
  NetParameter *param_local;
  
  blob_name_to_last_top_idx._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)param_upgraded_pad;
  NetParameter::Clear(param_upgraded_pad);
  NetParameter::CopyFrom
            ((NetParameter *)
             blob_name_to_last_top_idx._M_t._M_impl.super__Rb_tree_header._M_node_count,param);
  NetParameter::clear_layers
            ((NetParameter *)
             blob_name_to_last_top_idx._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)local_48);
  for (local_4c = 0; iVar4 = local_4c, iVar3 = NetParameter::input_size(param), iVar4 < iVar3;
      local_4c = local_4c + 1) {
    psStack_68 = NetParameter::input_abi_cxx11_(param,local_4c);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)local_48,psStack_68);
    *pmVar5 = -1;
  }
  for (layer_connection._4_4_ = 0; iVar4 = layer_connection._4_4_,
      iVar3 = NetParameter::layers_size(param), iVar4 < iVar3;
      layer_connection._4_4_ = layer_connection._4_4_ + 1) {
    layer_param = (V0LayerParameter *)NetParameter::layers(param,layer_connection._4_4_);
    pVStack_80 = V1LayerParameter::layer((V1LayerParameter *)layer_param);
    psVar6 = V0LayerParameter::type_abi_cxx11_(pVStack_80);
    bVar2 = std::operator!=(psVar6,"padding");
    if (bVar2) {
      pVVar9 = NetParameter::add_layers
                         ((NetParameter *)
                          blob_name_to_last_top_idx._M_t._M_impl.super__Rb_tree_header._M_node_count
                         );
      V1LayerParameter::CopyFrom(pVVar9,(V1LayerParameter *)layer_param);
    }
    for (blob_name_1._4_4_ = 0; iVar4 = blob_name_1._4_4_,
        iVar3 = V1LayerParameter::bottom_size((V1LayerParameter *)layer_param), iVar4 < iVar3;
        blob_name_1._4_4_ = blob_name_1._4_4_ + 1) {
      local_90 = V1LayerParameter::bottom_abi_cxx11_
                           ((V1LayerParameter *)layer_param,blob_name_1._4_4_);
      local_98._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)local_48,local_90);
      iStack_a0 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)local_48);
      bVar2 = std::operator==(&local_98,&stack0xffffffffffffff60);
      if (bVar2) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Unknown blob input ");
        poVar7 = std::operator<<(poVar7,(string *)local_90);
        poVar7 = std::operator<<(poVar7," to layer ");
        std::ostream::operator<<(poVar7,blob_name_1._4_4_);
      }
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_48,local_90);
      source_layer._4_4_ = *pmVar5;
      if (source_layer._4_4_ != -1) {
        local_b0 = NetParameter::layers(param,source_layer._4_4_);
        pVVar8 = V1LayerParameter::layer(local_b0);
        psVar6 = V0LayerParameter::type_abi_cxx11_(pVVar8);
        bVar2 = std::operator==(psVar6,"padding");
        if (bVar2) {
          null_stream::operator<<
                    (&local_b2,"Padding layer input to non-convolutional / non-pooling layer type ")
          ;
          psVar6 = V0LayerParameter::type_abi_cxx11_(pVStack_80);
          std::__cxx11::string::string((string *)&local_d8,(string *)psVar6);
          null_stream::operator<<(&local_b1,&local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
          null_stream::operator<<
                    ((null_stream *)((long)&layer_index + 2),
                     "Conv Layer takes a single blob as input.");
          null_stream::operator<<
                    ((null_stream *)&layer_index,"Padding Layer takes a single blob as input.");
          null_stream::operator<<
                    ((null_stream *)((long)&j_1 + 2),
                     "Padding Layer produces a single blob as output.");
          iVar4 = NetParameter::layers_size
                            ((NetParameter *)
                             blob_name_to_last_top_idx._M_t._M_impl.super__Rb_tree_header.
                             _M_node_count);
          pVVar9 = NetParameter::mutable_layers
                             ((NetParameter *)
                              blob_name_to_last_top_idx._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count,iVar4 + -1);
          pVVar8 = V1LayerParameter::mutable_layer(pVVar9);
          this = V1LayerParameter::layer(local_b0);
          value = V0LayerParameter::pad(this);
          V0LayerParameter::set_pad(pVVar8,value);
          pVVar9 = NetParameter::mutable_layers
                             ((NetParameter *)
                              blob_name_to_last_top_idx._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count,iVar4 + -1);
          iVar4 = blob_name_1._4_4_;
          psVar6 = V1LayerParameter::bottom_abi_cxx11_(local_b0,0);
          V1LayerParameter::set_bottom(pVVar9,iVar4,psVar6);
        }
      }
    }
    for (blob_name_2._0_4_ = 0; iVar4 = V1LayerParameter::top_size((V1LayerParameter *)layer_param),
        (int)blob_name_2 < iVar4; blob_name_2._0_4_ = (int)blob_name_2 + 1) {
      psVar6 = V1LayerParameter::top_abi_cxx11_((V1LayerParameter *)layer_param,(int)blob_name_2);
      mVar1 = layer_connection._4_4_;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_48,psVar6);
      *pmVar5 = mVar1;
    }
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)local_48);
  return;
}

Assistant:

void UpgradeV0PaddingLayers(const NetParameter& param,
                            NetParameter* param_upgraded_pad) {
  // Copy everything other than the layers from the original param.
  param_upgraded_pad->Clear();
  param_upgraded_pad->CopyFrom(param);
  param_upgraded_pad->clear_layers();
  // Figure out which layer each bottom blob comes from.
  map<string, int> blob_name_to_last_top_idx;
  for (int i = 0; i < param.input_size(); ++i) {
    const string& blob_name = param.input(i);
    blob_name_to_last_top_idx[blob_name] = -1;
  }
  for (int i = 0; i < param.layers_size(); ++i) {
    const V1LayerParameter& layer_connection = param.layers(i);
    const V0LayerParameter& layer_param = layer_connection.layer();
    // Add the layer to the new net, unless it's a padding layer.
    if (layer_param.type() != "padding") {
      param_upgraded_pad->add_layers()->CopyFrom(layer_connection);
    }
    for (int j = 0; j < layer_connection.bottom_size(); ++j) {
      const string& blob_name = layer_connection.bottom(j);
      if (blob_name_to_last_top_idx.find(blob_name) ==
          blob_name_to_last_top_idx.end()) {
        LOG(FATAL) << "Unknown blob input " << blob_name << " to layer " << j;
      }
      const int top_idx = blob_name_to_last_top_idx[blob_name];
      if (top_idx == -1) {
        continue;
      }
      const V1LayerParameter& source_layer = param.layers(top_idx);
      if (source_layer.layer().type() == "padding") {
        // This layer has a padding layer as input -- check that it is a conv
        // layer or a pooling layer and takes only one input.  Also check that
        // the padding layer input has only one input and one output.  Other
        // cases have undefined behavior in Caffe.
        CHECK((layer_param.type() == "conv") || (layer_param.type() == "pool"))
            << "Padding layer input to "
            "non-convolutional / non-pooling layer type "
            << layer_param.type();
        CHECK_EQ(layer_connection.bottom_size(), 1)
            << "Conv Layer takes a single blob as input.";
        CHECK_EQ(source_layer.bottom_size(), 1)
            << "Padding Layer takes a single blob as input.";
        CHECK_EQ(source_layer.top_size(), 1)
            << "Padding Layer produces a single blob as output.";
        int layer_index = param_upgraded_pad->layers_size() - 1;
        param_upgraded_pad->mutable_layers(layer_index)->mutable_layer()
            ->set_pad(source_layer.layer().pad());
        param_upgraded_pad->mutable_layers(layer_index)
            ->set_bottom(j, source_layer.bottom(0));
      }
    }
    for (int j = 0; j < layer_connection.top_size(); ++j) {
      const string& blob_name = layer_connection.top(j);
      blob_name_to_last_top_idx[blob_name] = i;
    }
  }
}